

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastShiftRight(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
                        Vec_Int_t *vRes)

{
  int iVar1;
  int local_3c;
  int local_38;
  int iRes;
  int i;
  int nShiftMax;
  int fSticky_local;
  int nShift_local;
  int *pShift_local;
  int nNum_local;
  int *pNum_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Abc_Base2Log(nNum);
  iRes = nShift;
  if (iVar1 < nShift) {
    local_3c = pShift[iVar1];
    local_38 = iVar1;
    while (local_38 = local_38 + 1, local_38 < nShift) {
      local_3c = Gia_ManHashOr(pNew,local_3c,pShift[local_38]);
    }
    iRes = iVar1 + 1;
    pShift[iVar1] = local_3c;
  }
  Wlc_BlastShiftRightInt(pNew,pNum,nNum,pShift,iRes,fSticky,vRes);
  return;
}

Assistant:

void Wlc_BlastShiftRight( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int nShiftMax = Abc_Base2Log(nNum);
    if ( nShiftMax < nShift )
    {
        int i, iRes = pShift[nShiftMax];
        for ( i = nShiftMax + 1; i < nShift; i++ )
            iRes = Gia_ManHashOr( pNew, iRes, pShift[i] );
        pShift[nShiftMax++] = iRes;
    }
    else 
        nShiftMax = nShift;
    Wlc_BlastShiftRightInt( pNew, pNum, nNum, pShift, nShiftMax, fSticky, vRes );
}